

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_callermsg(lua_State *L,char *msg)

{
  TValue *pTVar1;
  ulong uVar2;
  cTValue *pcVar3;
  cTValue *pcVar4;
  cTValue *frame;
  
  if (*(long *)((L->glref).ptr64 + 0x178) == 0) {
    pTVar1 = L->base;
    pcVar3 = pTVar1 + -1;
    uVar2 = pTVar1[-1].u64;
    pcVar4 = pcVar3;
    if ((uVar2 & 3) == 0) {
      frame = pcVar3 + (-2 - (ulong)*(byte *)(uVar2 - 3));
      goto LAB_001148c9;
    }
    if (((uint)uVar2 & 7) == 2) {
      if (pTVar1[-4].u64 == 1) {
        pcVar4 = (cTValue *)0x0;
        frame = pcVar3;
      }
      else {
        frame = (cTValue *)((long)pcVar3 - (uVar2 & 0xfffffffffffffff8));
        if ((byte)(*(char *)((pTVar1[-2].u64 & 0x7fffffffffff) + 10) + 0x49U) < 0x10) {
          L->base = frame + 1;
          L->top = pcVar3;
          *(TValue *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18) = pTVar1[-3];
        }
      }
      goto LAB_001148c9;
    }
  }
  else {
    pcVar3 = (cTValue *)0x0;
  }
  frame = (cTValue *)0x0;
  pcVar4 = pcVar3;
LAB_001148c9:
  lj_debug_addloc(L,msg,frame,pcVar4);
  lj_err_run(L);
}

Assistant:

LJ_NOINLINE void lj_err_callermsg(lua_State *L, const char *msg)
{
  TValue *frame = NULL, *pframe = NULL;
  if (!(LJ_HASJIT && tvref(G(L)->jit_base))) {
    frame = L->base-1;
    if (frame_islua(frame)) {
      pframe = frame_prevl(frame);
    } else if (frame_iscont(frame)) {
      if (frame_iscont_fficb(frame)) {
	pframe = frame;
	frame = NULL;
      } else {
	pframe = frame_prevd(frame);
#if LJ_HASFFI
	/* Remove frame for FFI metamethods. */
	if (frame_func(frame)->c.ffid >= FF_ffi_meta___index &&
	    frame_func(frame)->c.ffid <= FF_ffi_meta___tostring) {
	  L->base = pframe+1;
	  L->top = frame;
	  setcframe_pc(cframe_raw(L->cframe), frame_contpc(frame));
	}
#endif
      }
    }
  }
  lj_debug_addloc(L, msg, pframe, frame);
  lj_err_run(L);
}